

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

int aes_init_dec(aes_context *ctx,uint8_t *key,int bits)

{
  uint32_t *puVar1;
  int iVar2;
  uint32_t uVar3;
  long lVar4;
  long local_160;
  size_t i;
  uint32_t *dkey;
  uint32_t *ekey;
  aes_context enc;
  int bits_local;
  uint8_t *key_local;
  aes_context *ctx_local;
  
  if (bits == 0x80) {
    ctx->nr = 10;
  }
  else {
    if (bits != 0x100) {
      return -1;
    }
    ctx->nr = 0xe;
  }
  enc.key[0x43] = bits;
  iVar2 = aes_supported_x86();
  if (iVar2 == 0) {
    iVar2 = aes_init((aes_context *)&ekey,key,enc.key[0x43]);
    if (iVar2 < 0) {
      ctx_local._4_4_ = -1;
    }
    else {
      lVar4 = (long)(ctx->nr << 2);
      ctx->key[0] = enc.key[lVar4 + -2];
      ctx->key[1] = enc.key[lVar4 + -1];
      ctx->key[2] = enc.key[lVar4];
      ctx->key[3] = enc.key[lVar4 + 1];
      dkey = enc.key + lVar4 + -6;
      puVar1 = ctx->key;
      for (local_160 = (long)(ctx->nr + -1); i = (size_t)(puVar1 + 4), local_160 != 0;
          local_160 = local_160 + -1) {
        uVar3 = setup_mix2(*dkey);
        *(uint32_t *)i = uVar3;
        uVar3 = setup_mix2(dkey[1]);
        puVar1[5] = uVar3;
        uVar3 = setup_mix2(dkey[2]);
        puVar1[6] = uVar3;
        uVar3 = setup_mix2(dkey[3]);
        puVar1[7] = uVar3;
        dkey = dkey + -4;
        puVar1 = (uint32_t *)i;
      }
      *(uint32_t *)i = *dkey;
      puVar1[5] = dkey[1];
      puVar1[6] = dkey[2];
      puVar1[7] = dkey[3];
      ctx_local._4_4_ = 0;
    }
  }
  else {
    aes_init_dec_x86(ctx,key);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int aes_init_dec(aes_context* ctx, const uint8_t* key, int bits)
{
    switch(bits) {
        case 128: ctx->nr = 10; break;
        case 256: ctx->nr = 14; break;
        default: return -1;
    }
#if PLATFORM_SUPPORTS_AESNI
    if (aes_supported_x86())
    {
        aes_init_dec_x86(ctx, key);
        return 0;
    }
#endif

    aes_context enc;
    if (aes_init(&enc, key, bits) < 0)
        return -1;

    uint32_t* ekey = enc.key + 4 * ctx->nr;
    uint32_t* dkey = ctx->key;

    *dkey++ = ekey[0];
    *dkey++ = ekey[1];
    *dkey++ = ekey[2];
    *dkey++ = ekey[3];
    ekey -= 4;

    for (size_t i = ctx->nr - 1; i > 0; i--)
    {
        *dkey++ = setup_mix2(ekey[0]);
        *dkey++ = setup_mix2(ekey[1]);
        *dkey++ = setup_mix2(ekey[2]);
        *dkey++ = setup_mix2(ekey[3]);
        ekey -= 4;
    }

    *dkey++ = ekey[0];
    *dkey++ = ekey[1];
    *dkey++ = ekey[2];
    *dkey++ = ekey[3];
    return 0;
}